

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O2

int __thiscall
CorUnix::CSynchCache<CorUnix::CSynchWaitController>::Get
          (CSynchCache<CorUnix::CSynchWaitController> *this,CPalThread *pthrCurrent,int n,
          CSynchWaitController **ppObjs)

{
  CSynchWaitController *pCVar1;
  _USynchCacheStackNode *p_Var2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  p_Var2 = (this->m_pHead).m_val;
  for (uVar4 = 0; (p_Var2 != (_USynchCacheStackNode *)0x0 && ((long)uVar4 < (long)n));
      uVar4 = uVar4 + 1) {
    ppObjs[uVar4] = (CSynchWaitController *)p_Var2;
    p_Var2 = p_Var2->next;
  }
  (this->m_pHead).m_val = p_Var2;
  (this->m_iDepth).m_val = (this->m_iDepth).m_val - (int)uVar4;
  if (((this->m_pHead).m_val == (_USynchCacheStackNode *)0x0) && ((this->m_iDepth).m_val != 0)) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  uVar3 = (ulong)(uint)n;
  if (n <= (int)uVar4) {
    uVar3 = uVar4 & 0xffffffff;
  }
  do {
    uVar5 = uVar3;
    if (uVar3 == uVar4) {
LAB_0033d774:
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pCVar1 = ppObjs[uVar4];
        (pCVar1->super_ISynchWaitController)._vptr_ISynchWaitController =
             (_func_int **)&PTR_CanThreadWaitWithoutBlocking_0135f9f8;
        pCVar1->m_pProcLocalData = (CProcProcessLocalData *)0x0;
      }
      return (int)uVar5;
    }
    p_Var2 = InternalNew<CorUnix::CSynchCache<CorUnix::CSynchWaitController>::_USynchCacheStackNode>
                       ();
    if (p_Var2 == (_USynchCacheStackNode *)0x0) {
      uVar3 = uVar4 & 0xffffffff;
      uVar5 = uVar4;
      goto LAB_0033d774;
    }
    memset(p_Var2,0,0x38);
    ppObjs[uVar4] = (CSynchWaitController *)p_Var2;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, T ** ppObjs)
        {
            void * pvObjRaw;
            USynchCacheStackNode * pNode;
            int i = 0,j;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {
                ppObjs[i] = (T *)pNode;
                pNode = pNode->next;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                // Can't use ASSERT here, since this is header
                // is included by other headers with inline methods
                // which causes template instatiation in the header
                // where the DEBUG CHANNEL is not defined and cannot
                // be defined
                fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                DebugBreak();
            }
#endif // _DEBUG

            Unlock(pthrCurrent);

            for (j=i;j<n;j++)
            {
                pvObjRaw = (void *) InternalNew<USynchCacheStackNode>();
                if (NULL == pvObjRaw)
                    break;
#ifdef _DEBUG
                memset(pvObjRaw, 0, sizeof(USynchCacheStackNode));
#endif
                ppObjs[j] = reinterpret_cast<T*>(pvObjRaw);
            }

            for (i=0;i<j;i++)
            {
                new ((void *)ppObjs[i]) T;
            }

            return j;
        }